

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

uint __thiscall
ObjectBlockPool<512,_128>::FreePending(ObjectBlockPool<512,_128> *this,uint *usedMemory)

{
  SmallBlock<512> *pSVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  MySmallBlock *freedBlock;
  
  uVar3 = (ulong)(this->objectsToFree).count;
  if (uVar3 == 0) {
    uVar2 = 0;
  }
  else {
    uVar4 = 0;
    uVar2 = 0;
    do {
      if ((this->objectsToFree).count <= uVar4) {
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,
                      "T &FastVector<SmallBlock<512> *>::operator[](unsigned int) [T = SmallBlock<512> *, zeroNewMemory = false, skipConstructor = false]"
                     );
      }
      pSVar1 = (this->objectsToFree).data[uVar4];
      if ((pSVar1->data[0] & 3U) == 0) {
        pSVar1->marker = (ulong)this->freeBlocks | 2;
        this->freeBlocks = pSVar1;
        uVar2 = uVar2 + 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  (this->objectsToFree).count = 0;
  *usedMemory = *usedMemory + uVar2 * -0x200;
  return uVar2;
}

Assistant:

unsigned FreePending(unsigned &usedMemory)
	{
		unsigned freed = 0;

		for(unsigned i = 0, e = objectsToFree.size(); i < e; i++)
		{
			MySmallBlock *block = objectsToFree[i];

			markerType &marker = block->marker;

			// Check flags again, finalizers might have some objects reachable
			if(!(marker & (NULLC::OBJECT_VISIBLE | NULLC::OBJECT_FREED)))
			{
				Free(block);

				freed++;
			}
		}

		objectsToFree.clear();

		usedMemory -= freed * elemSize;

		return freed;
	}